

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_charset_compute_cids(CFF_Charset charset,FT_UInt num_glyphs,FT_Memory memory)

{
  FT_UShort *pFVar1;
  ushort local_32;
  ulong uStack_30;
  FT_UShort max_cid;
  FT_Long j;
  FT_UInt i;
  FT_Error error;
  FT_Memory memory_local;
  CFF_Charset pCStack_10;
  FT_UInt num_glyphs_local;
  CFF_Charset charset_local;
  
  j._4_4_ = 0;
  local_32 = 0;
  if (charset->max_cid == 0) {
    for (j._0_4_ = 0; (uint)j < num_glyphs; j._0_4_ = (uint)j + 1) {
      if (local_32 < charset->sids[(uint)j]) {
        local_32 = charset->sids[(uint)j];
      }
    }
    _i = memory;
    memory_local._4_4_ = num_glyphs;
    pCStack_10 = charset;
    pFVar1 = (FT_UShort *)
             ft_mem_realloc(memory,2,0,(ulong)local_32 + 1,(void *)0x0,(FT_Error *)((long)&j + 4));
    pCStack_10->cids = pFVar1;
    if (j._4_4_ == 0) {
      uStack_30 = (ulong)memory_local._4_4_;
      while (uStack_30 = uStack_30 - 1, -1 < (long)uStack_30) {
        pCStack_10->cids[pCStack_10->sids[uStack_30]] = (FT_UShort)uStack_30;
      }
      pCStack_10->max_cid = (uint)local_32;
      pCStack_10->num_glyphs = memory_local._4_4_;
    }
  }
  return j._4_4_;
}

Assistant:

static FT_Error
  cff_charset_compute_cids( CFF_Charset  charset,
                            FT_UInt      num_glyphs,
                            FT_Memory    memory )
  {
    FT_Error   error   = FT_Err_Ok;
    FT_UInt    i;
    FT_Long    j;
    FT_UShort  max_cid = 0;


    if ( charset->max_cid > 0 )
      goto Exit;

    for ( i = 0; i < num_glyphs; i++ )
    {
      if ( charset->sids[i] > max_cid )
        max_cid = charset->sids[i];
    }

    if ( FT_NEW_ARRAY( charset->cids, (FT_ULong)max_cid + 1 ) )
      goto Exit;

    /* When multiple GIDs map to the same CID, we choose the lowest */
    /* GID.  This is not described in any spec, but it matches the  */
    /* behaviour of recent Acroread versions.                       */
    for ( j = (FT_Long)num_glyphs - 1; j >= 0; j-- )
      charset->cids[charset->sids[j]] = (FT_UShort)j;

    charset->max_cid    = max_cid;
    charset->num_glyphs = num_glyphs;

  Exit:
    return error;
  }